

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  uchar *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  unsigned_short *puVar7;
  int *piVar8;
  uint uVar9;
  bool bVar10;
  uchar *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uchar *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  uchar *puVar23;
  uint uVar24;
  size_t sVar25;
  uint uVar26;
  size_t left_1;
  ulong uVar27;
  uint uVar28;
  size_t left;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  uint local_c4;
  ulong local_b0;
  size_t local_a8;
  ulong local_60;
  uchar *puVar29;
  
  uVar12 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar12 = windowsize;
  }
  uVar18 = 0x40;
  if (0x1fff < windowsize) {
    uVar18 = 0x102;
  }
  local_c4 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar13 = windowsize - 1;
    local_c4 = 0x5a;
    if ((windowsize & uVar13) == 0) {
      uVar21 = 0x102;
      if (nicematch < 0x102) {
        uVar21 = nicematch;
      }
      local_c4 = 0;
      if (inpos < insize) {
        puVar16 = in + insize;
        local_60 = 0;
        uVar9 = 0;
        bVar10 = false;
        uVar24 = 0;
        local_c4 = 0;
        local_a8 = inpos;
        do {
          uVar14 = getHash(in,insize,local_a8);
          uVar27 = 0;
          if (uVar14 == 0) {
            if (uVar24 == 0) {
              puVar1 = in + local_a8;
              puVar23 = puVar1;
              puVar29 = in + local_a8 + 0x102;
              if (puVar16 < in + local_a8 + 0x102) {
                puVar29 = puVar16;
              }
              for (; (puVar23 != puVar29 && (*puVar23 == '\0')); puVar23 = puVar23 + 1) {
              }
              uVar27 = (ulong)(uint)((int)puVar23 - (int)puVar1);
            }
            else {
              if ((insize < uVar24 + local_a8) || (in[(uVar24 + local_a8) - 1] != '\0')) {
                uVar24 = uVar24 - 1;
              }
              uVar27 = (ulong)uVar24;
            }
          }
          uVar24 = (uint)uVar27;
          uVar26 = (uint)local_a8 & uVar13;
          uVar17 = (ulong)uVar26;
          piVar5 = hash->val;
          piVar5[uVar17] = uVar14;
          piVar6 = hash->head;
          if (piVar6[uVar14] != -1) {
            hash->chain[uVar17] = (unsigned_short)piVar6[uVar14];
          }
          piVar6[uVar14] = uVar26;
          puVar7 = hash->zeros;
          puVar7[uVar17] = (unsigned_short)uVar27;
          piVar8 = hash->headz;
          if (piVar8[uVar27 & 0xffff] != -1) {
            hash->chainz[uVar17] = (unsigned_short)piVar8[uVar27 & 0xffff];
          }
          uVar31 = local_a8 + 0x102;
          if (insize <= local_a8 + 0x102) {
            uVar31 = insize;
          }
          piVar8[uVar27 & 0xffff] = uVar26;
          if (uVar12 == 0) {
            local_b0 = 0;
            uVar26 = 0;
          }
          else {
            puVar1 = in + local_a8;
            uVar26 = 0;
            local_b0 = 0;
            uVar19 = 0;
            uVar20 = (ulong)hash->chain[uVar17];
            uVar15 = 1;
            do {
              uVar22 = 0;
              if (uVar17 < uVar20) {
                uVar22 = (ulong)windowsize;
              }
              uVar22 = (uVar17 - uVar20) + uVar22;
              if ((uint)uVar22 < (uint)uVar19) break;
              if (uVar22 != 0) {
                puVar23 = in + (local_a8 - (uVar22 & 0xffffffff));
                puVar29 = puVar1;
                puVar11 = puVar1;
                if (2 < uVar24) {
                  uVar19 = (ulong)(uint)puVar7[uVar20];
                  if (uVar24 < puVar7[uVar20]) {
                    uVar19 = uVar27;
                  }
                  puVar23 = puVar23 + uVar19;
                  puVar29 = puVar1 + uVar19;
                  puVar11 = puVar1 + uVar19;
                }
                for (; (puVar11 != in + uVar31 && (puVar29 = puVar11, *puVar23 == *puVar11));
                    puVar23 = puVar23 + 1) {
                  puVar29 = in + uVar31;
                  puVar11 = puVar11 + 1;
                }
                uVar28 = (int)puVar29 - (int)puVar1;
                if ((uVar26 < uVar28) &&
                   (local_b0 = uVar22 & 0xffffffff, uVar26 = uVar28, uVar21 <= uVar28)) {
                  local_b0 = uVar22 & 0xffffffff;
                  break;
                }
              }
              uVar3 = hash->chain[uVar20];
              uVar30 = (ulong)uVar3;
              if ((ushort)uVar20 == uVar3) break;
              if ((uVar24 < 3) || (uVar26 <= uVar24)) {
                if (piVar5[uVar3] != uVar14) break;
              }
              else {
                uVar30 = (ulong)hash->chainz[uVar20];
                if (uVar24 != puVar7[uVar30]) break;
              }
              bVar32 = uVar15 != uVar12;
              uVar19 = uVar22;
              uVar20 = uVar30;
              uVar15 = uVar15 + 1;
            } while (bVar32);
          }
          if (lazymatching == 0) {
LAB_00317e0e:
            if ((uVar26 < 3) || ((uint)local_b0 <= windowsize)) {
              if (((uVar26 < 3) || (uVar26 < minmatch)) ||
                 ((uVar26 == 3 && (0x1000 < (uint)local_b0)))) {
                bVar2 = in[local_a8];
                uVar14 = uivector_resize(out,out->size + 1);
                if (uVar14 == 0) {
                  local_c4 = 0x53;
                  bVar32 = false;
                }
                else {
                  out->data[out->size - 1] = (uint)bVar2;
                  bVar32 = true;
                }
              }
              else {
                uVar17 = 0x1c;
                uVar31 = 1;
                do {
                  uVar19 = uVar17 + uVar31 >> 1;
                  if (LENGTHBASE[uVar19] < uVar26) {
                    uVar31 = uVar19 + 1;
                  }
                  else {
                    uVar17 = uVar19 - 1;
                  }
                } while (uVar31 <= uVar17);
                if ((0x1c < uVar31) || (uVar26 < LENGTHBASE[uVar31])) {
                  uVar31 = uVar31 - 1;
                }
                uVar24 = LENGTHBASE[uVar31 & 0xffffffff];
                uVar17 = 0x1d;
                uVar19 = 1;
                do {
                  uVar20 = uVar17 + uVar19 >> 1;
                  if (DISTANCEBASE[uVar20] < (uint)local_b0) {
                    uVar19 = uVar20 + 1;
                  }
                  else {
                    uVar17 = uVar20 - 1;
                  }
                } while (uVar19 <= uVar17);
                if ((0x1d < uVar19) || ((uint)local_b0 < DISTANCEBASE[uVar19])) {
                  uVar19 = uVar19 - 1;
                }
                uVar14 = DISTANCEBASE[uVar19 & 0xffffffff];
                uVar15 = uivector_resize(out,out->size + 1);
                if (uVar15 != 0) {
                  out->data[out->size - 1] = (int)uVar31 + 0x101;
                }
                uVar15 = uivector_resize(out,out->size + 1);
                if (uVar15 != 0) {
                  out->data[out->size - 1] = uVar26 - uVar24;
                }
                uVar24 = uivector_resize(out,out->size + 1);
                if (uVar24 != 0) {
                  out->data[out->size - 1] = (uint)uVar19;
                }
                uVar24 = uivector_resize(out,out->size + 1);
                if (uVar24 != 0) {
                  out->data[out->size - 1] = (uint)local_b0 - uVar14;
                }
                piVar5 = hash->head;
                piVar6 = hash->val;
                puVar7 = hash->zeros;
                piVar8 = hash->headz;
                if (uVar26 < 3) {
                  uVar26 = 2;
                }
                uVar14 = 1;
                sVar25 = local_a8;
                do {
                  local_a8 = sVar25 + 1;
                  uVar15 = getHash(in,insize,local_a8);
                  uVar17 = 0;
                  if (uVar15 == 0) {
                    if ((int)uVar27 == 0) {
                      puVar1 = in + local_a8;
                      puVar23 = puVar1;
                      puVar29 = in + sVar25 + 0x103;
                      if (puVar16 < in + sVar25 + 0x103) {
                        puVar29 = puVar16;
                      }
                      for (; (puVar23 != puVar29 && (*puVar23 == '\0')); puVar23 = puVar23 + 1) {
                      }
                      uVar17 = (ulong)(uint)((int)puVar23 - (int)puVar1);
                    }
                    else if ((insize < local_a8 + uVar27) ||
                            (uVar17 = uVar27, in[uVar27 + sVar25] != '\0')) {
                      uVar17 = (ulong)((int)uVar27 - 1);
                    }
                  }
                  uVar24 = (uint)uVar17;
                  uVar28 = (uint)local_a8 & uVar13;
                  piVar6[uVar28] = uVar15;
                  iVar4 = piVar5[uVar15];
                  if (iVar4 != -1) {
                    hash->chain[uVar28] = (unsigned_short)iVar4;
                  }
                  piVar5[uVar15] = uVar28;
                  puVar7[uVar28] = (unsigned_short)uVar17;
                  iVar4 = piVar8[uVar17 & 0xffff];
                  if (iVar4 != -1) {
                    hash->chainz[uVar28] = (unsigned_short)iVar4;
                  }
                  piVar8[uVar17 & 0xffff] = uVar28;
                  uVar14 = uVar14 + 1;
                  sVar25 = local_a8;
                  uVar27 = uVar17;
                } while (uVar14 != uVar26);
                bVar32 = true;
              }
            }
            else {
              bVar32 = false;
              local_c4 = 0x56;
            }
          }
          else {
            if (((bVar10) || (uVar26 < 3)) || (uVar18 < uVar26 || 0x101 < uVar26)) {
              if (bVar10) {
                if (local_a8 == 0) {
                  bVar10 = false;
                  local_c4 = 0x51;
                  local_a8 = 0;
                  bVar32 = false;
                  goto LAB_003181ba;
                }
                if (uVar9 + 1 < uVar26) {
                  bVar2 = in[local_a8 - 1];
                  uVar14 = uivector_resize(out,out->size + 1);
                  if (uVar14 == 0) {
                    bVar10 = false;
                    local_c4 = 0x53;
                    bVar32 = false;
                    goto LAB_003181ba;
                  }
                  out->data[out->size - 1] = (uint)bVar2;
                  bVar10 = false;
                }
                else {
                  piVar6[uVar14] = -1;
                  piVar8[uVar27] = -1;
                  local_a8 = local_a8 - 1;
                  bVar10 = false;
                  local_b0._0_4_ = (uint)local_60;
                  uVar26 = uVar9;
                }
              }
              else {
                bVar10 = false;
              }
              goto LAB_00317e0e;
            }
            bVar32 = true;
            bVar10 = true;
            local_60 = local_b0;
            uVar9 = uVar26;
          }
LAB_003181ba:
        } while ((bVar32) && (local_a8 = local_a8 + 1, local_a8 < insize));
      }
    }
  }
  return local_c4;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}